

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

void EPSG_setFlags(EPSG *psg,UINT8 flags)

{
  UINT8 flags_local;
  EPSG *psg_local;
  
  psg->chp_flags = flags;
  internal_refresh(psg);
  if ((psg->chp_flags & 0x80) == 0) {
    psg->stereo_mask[0] = '\x03';
    psg->stereo_mask[1] = '\x03';
    psg->stereo_mask[2] = '\x03';
  }
  else {
    psg->stereo_mask[0] = '\x01';
    psg->stereo_mask[1] = '\x03';
    psg->stereo_mask[2] = '\x02';
  }
  return;
}

Assistant:

void
EPSG_setFlags (EPSG * psg, UINT8 flags)
{
  psg->chp_flags = flags;

  internal_refresh(psg);  // in case of changed clock divider pin

  if (psg->chp_flags & AY8910_ZX_STEREO)
  {
    // ABC Stereo
    psg->stereo_mask[0] = 0x01;
    psg->stereo_mask[1] = 0x03;
    psg->stereo_mask[2] = 0x02;
  }
  else
  {
    psg->stereo_mask[0] = 0x03;
    psg->stereo_mask[1] = 0x03;
    psg->stereo_mask[2] = 0x03;
  }

  return;
}